

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::Build_Function_Caller_Helper<chaiscript::Boxed_Value>::operator()<>
          (Build_Function_Caller_Helper<chaiscript::Boxed_Value> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RSI;
  element_type *in_RDI;
  Boxed_Value BVar2;
  Type_Conversions_State *in_stack_00000058;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *in_stack_00000060;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *in_stack_00000068;
  Type_Conversions_State state;
  Conversion_Saves *in_stack_ffffffffffffff60;
  Type_Conversions *t_conversions;
  Type_Conversions_State *in_stack_ffffffffffffff70;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *this_00;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_38 [2];
  
  if (*(long *)(in_RSI + 0x18) == 0) {
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
              ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)0x32842d
              );
    Function_Caller_Ret<chaiscript::Boxed_Value,_false>::call
              (in_stack_00000068,in_stack_00000060,in_stack_00000058);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
              ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               in_stack_ffffffffffffff70);
    _Var1._M_pi = extraout_RDX_00;
  }
  else {
    t_conversions = *(Type_Conversions **)(in_RSI + 0x18);
    Type_Conversions::conversion_saves((Type_Conversions *)0x32838f);
    Type_Conversions_State::Type_Conversions_State
              (in_stack_ffffffffffffff70,t_conversions,in_stack_ffffffffffffff60);
    local_38[0].
    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38[0].
    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38[0].
    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = local_38;
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
              ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)0x3283cc
              );
    Function_Caller_Ret<chaiscript::Boxed_Value,_false>::call
              (in_stack_00000068,in_stack_00000060,in_stack_00000058);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(this_00)
    ;
    _Var1._M_pi = extraout_RDX;
  }
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret operator()(P&&  ...  param)
          {
            if (m_conversions) {
              Type_Conversions_State state(*m_conversions, m_conversions->conversion_saves());
              return Function_Caller_Ret<Ret, std::is_arithmetic<Ret>::value && !std::is_same<Ret, bool>::value>::call(m_funcs, { 
                  box<P>(std::forward<P>(param))...
                  }, &state
                  );
            } else {
              return Function_Caller_Ret<Ret, std::is_arithmetic<Ret>::value && !std::is_same<Ret, bool>::value>::call(m_funcs, { 
                  box<P>(std::forward<P>(param))...
                  }, nullptr
                  );
            }

          }